

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fetch.hpp
# Opt level: O3

void __thiscall
TI::TMS::SMSSequencer<(TI::TMS::Personality)3>::fetch<17>
          (SMSSequencer<(TI::TMS::Personality)3> *this)

{
  Base<(TI::TMS::Personality)3> *pBVar1;
  
  pBVar1 = (this->fetcher).base;
  Base<(TI::TMS::Personality)3>::posit_sprite
            (pBVar1,0,(uint)(pBVar1->ram_)._M_elems
                            [(ulong)*(byte *)((long)&((this->fetcher).storage)->
                                                     sprite_attribute_table_address_ + 1) * 0x100],
             (this->fetcher).y);
  pBVar1 = (this->fetcher).base;
  Base<(TI::TMS::Personality)3>::posit_sprite
            (pBVar1,1,(uint)(pBVar1->ram_)._M_elems
                            [((this->fetcher).storage)->sprite_attribute_table_address_ & 0xff01],
             (this->fetcher).y);
  pBVar1 = (this->fetcher).base;
  Base<(TI::TMS::Personality)3>::posit_sprite
            (pBVar1,2,(uint)(pBVar1->ram_)._M_elems
                            [((this->fetcher).storage)->sprite_attribute_table_address_ & 0xff02],
             (this->fetcher).y);
  pBVar1 = (this->fetcher).base;
  Base<(TI::TMS::Personality)3>::posit_sprite
            (pBVar1,3,(uint)(pBVar1->ram_)._M_elems
                            [((this->fetcher).storage)->sprite_attribute_table_address_ & 0xff03],
             (this->fetcher).y);
  pBVar1 = (this->fetcher).base;
  Base<(TI::TMS::Personality)3>::posit_sprite
            (pBVar1,4,(uint)(pBVar1->ram_)._M_elems
                            [((this->fetcher).storage)->sprite_attribute_table_address_ & 0xff04],
             (this->fetcher).y);
  pBVar1 = (this->fetcher).base;
  Base<(TI::TMS::Personality)3>::posit_sprite
            (pBVar1,5,(uint)(pBVar1->ram_)._M_elems
                            [((this->fetcher).storage)->sprite_attribute_table_address_ & 0xff05],
             (this->fetcher).y);
  pBVar1 = (this->fetcher).base;
  Base<(TI::TMS::Personality)3>::posit_sprite
            (pBVar1,6,(uint)(pBVar1->ram_)._M_elems
                            [((this->fetcher).storage)->sprite_attribute_table_address_ & 0xff06],
             (this->fetcher).y);
  pBVar1 = (this->fetcher).base;
  Base<(TI::TMS::Personality)3>::posit_sprite
            (pBVar1,7,(uint)(pBVar1->ram_)._M_elems
                            [((this->fetcher).storage)->sprite_attribute_table_address_ & 0xff07],
             (this->fetcher).y);
  pBVar1 = (this->fetcher).base;
  Base<(TI::TMS::Personality)3>::posit_sprite
            (pBVar1,8,(uint)(pBVar1->ram_)._M_elems
                            [((this->fetcher).storage)->sprite_attribute_table_address_ & 0xff08],
             (this->fetcher).y);
  pBVar1 = (this->fetcher).base;
  Base<(TI::TMS::Personality)3>::posit_sprite
            (pBVar1,9,(uint)(pBVar1->ram_)._M_elems
                            [((this->fetcher).storage)->sprite_attribute_table_address_ & 0xff09],
             (this->fetcher).y);
  pBVar1 = (this->fetcher).base;
  Base<(TI::TMS::Personality)3>::posit_sprite
            (pBVar1,10,
             (uint)(pBVar1->ram_)._M_elems
                   [((this->fetcher).storage)->sprite_attribute_table_address_ & 0xff0a],
             (this->fetcher).y);
  pBVar1 = (this->fetcher).base;
  Base<(TI::TMS::Personality)3>::posit_sprite
            (pBVar1,0xb,
             (uint)(pBVar1->ram_)._M_elems
                   [((this->fetcher).storage)->sprite_attribute_table_address_ & 0xff0b],
             (this->fetcher).y);
  pBVar1 = (this->fetcher).base;
  Base<(TI::TMS::Personality)3>::posit_sprite
            (pBVar1,0xc,
             (uint)(pBVar1->ram_)._M_elems
                   [((this->fetcher).storage)->sprite_attribute_table_address_ & 0xff0c],
             (this->fetcher).y);
  pBVar1 = (this->fetcher).base;
  Base<(TI::TMS::Personality)3>::posit_sprite
            (pBVar1,0xd,
             (uint)(pBVar1->ram_)._M_elems
                   [((this->fetcher).storage)->sprite_attribute_table_address_ & 0xff0d],
             (this->fetcher).y);
  pBVar1 = (this->fetcher).base;
  Base<(TI::TMS::Personality)3>::posit_sprite
            (pBVar1,0xe,
             (uint)(pBVar1->ram_)._M_elems
                   [((this->fetcher).storage)->sprite_attribute_table_address_ & 0xff0e],
             (this->fetcher).y);
  pBVar1 = (this->fetcher).base;
  Base<(TI::TMS::Personality)3>::posit_sprite
            (pBVar1,0xf,
             (uint)(pBVar1->ram_)._M_elems
                   [((this->fetcher).storage)->sprite_attribute_table_address_ & 0xff0f],
             (this->fetcher).y);
  return;
}

Assistant:

void fetch() {
		if(cycle < 3) {
			fetcher.base->do_external_slot(to_internal<personality, Clock::TMSMemoryWindow, Clock::FromStartOfSync>(cycle));
		}

		if(cycle == 3) {
			fetcher.fetch_sprite(4);
			fetcher.fetch_sprite(5);
			fetcher.fetch_sprite(6);
			fetcher.fetch_sprite(7);
		}

		if(cycle == 15 || cycle == 16) {
			fetcher.base->do_external_slot(to_internal<personality, Clock::TMSMemoryWindow, Clock::FromStartOfSync>(cycle));
		}

		if(cycle == 17) {
			fetcher.posit_sprite(0);	fetcher.posit_sprite(1);	fetcher.posit_sprite(2);	fetcher.posit_sprite(3);
			fetcher.posit_sprite(4);	fetcher.posit_sprite(5);	fetcher.posit_sprite(6);	fetcher.posit_sprite(7);
			fetcher.posit_sprite(8);	fetcher.posit_sprite(9);	fetcher.posit_sprite(10);	fetcher.posit_sprite(11);
			fetcher.posit_sprite(12);	fetcher.posit_sprite(13);	fetcher.posit_sprite(14);	fetcher.posit_sprite(15);
		}

		if(cycle >= 25 && cycle < 153) {
			constexpr int offset = cycle - 25;
			constexpr int block = offset >> 2;
			constexpr int sub_block = offset & 3;

			switch(sub_block) {
				default: break;

				case 0:	fetcher.fetch_tile_name(block);		break;
				case 1:
					if(!(block & 3)) {
						fetcher.base->do_external_slot(to_internal<personality, Clock::TMSMemoryWindow, Clock::FromStartOfSync>(cycle));
					} else {
						constexpr int sprite = (8 + ((block >> 2) * 3) + ((block & 3) - 1)) << 1;
						fetcher.posit_sprite(sprite);
						fetcher.posit_sprite(sprite+1);
					}
				break;
				case 2:	fetcher.fetch_tile_pattern(block);	break;
			}
		}

		if(cycle >= 153 && cycle < 157) {
			fetcher.base->do_external_slot(to_internal<personality, Clock::TMSMemoryWindow, Clock::FromStartOfSync>(cycle));
		}

		if(cycle == 157) {
			fetcher.fetch_sprite(0);
			fetcher.fetch_sprite(1);
			fetcher.fetch_sprite(2);
			fetcher.fetch_sprite(3);
		}

		if(cycle >= 169) {
			fetcher.base->do_external_slot(to_internal<personality, Clock::TMSMemoryWindow, Clock::FromStartOfSync>(cycle));
		}
	}